

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureViewVkImpl.cpp
# Opt level: O3

void __thiscall Diligent::TextureViewVkImpl::~TextureViewVkImpl(TextureViewVkImpl *this)

{
  FramebufferCache *this_00;
  ITexture *pIVar1;
  ISampler *pIVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  RenderDeviceVkImpl *this_01;
  
  this_01 = (this->super_TextureViewBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
            .m_pDevice;
  this_00 = (this_01->m_FramebufferCache)._M_t.
            super___uniq_ptr_impl<Diligent::FramebufferCache,_std::default_delete<Diligent::FramebufferCache>_>
            ._M_t.
            super__Tuple_impl<0UL,_Diligent::FramebufferCache_*,_std::default_delete<Diligent::FramebufferCache>_>
            .super__Head_base<0UL,_Diligent::FramebufferCache_*,_false>._M_head_impl;
  if (((this_00 != (FramebufferCache *)0x0) &&
      (uVar3 = (uint)(this->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                     super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                     .m_Desc.ViewType, uVar3 < 7)) && ((0x5cU >> (uVar3 & 0x1f) & 1) != 0)) {
    FramebufferCache::OnDestroyImageView(this_00,(this->m_ImageView).m_VkObject);
    this_01 = (this->super_TextureViewBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
              .m_pDevice;
  }
  iVar4 = (*(((this->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pTexture)->
            super_IDeviceObject).super_IObject._vptr_IObject[4])();
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
  ::
  SafeReleaseDeviceObject<VulkanUtilities::VulkanObjectWrapper<VkImageView_T*,(VulkanUtilities::VulkanHandleTypeId)5>,void>
            ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
              *)this_01,&this->m_ImageView,*(Uint64 *)(CONCAT44(extraout_var,iVar4) + 0x48));
  VulkanUtilities::VulkanObjectWrapper<VkImageView_T_*,_(VulkanUtilities::VulkanHandleTypeId)5>::
  ~VulkanObjectWrapper(&this->m_ImageView);
  (this->super_TextureViewBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
  .super_ObjectBase<Diligent::ITextureViewVk>.super_RefCountedObject<Diligent::ITextureViewVk>.
  super_ITextureViewVk.super_ITextureView.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_00aeeb98;
  pIVar1 = (this->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_spTexture.m_pObject;
  if (pIVar1 != (ITexture *)0x0) {
    (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[2])();
    (this->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_spTexture.m_pObject =
         (ITexture *)0x0;
  }
  pIVar2 = (this->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pSampler.m_pObject;
  if (pIVar2 != (ISampler *)0x0) {
    (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[2])();
    (this->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pSampler.m_pObject =
         (ISampler *)0x0;
  }
  DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
  ::~DeviceObjectBase((DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                       *)this);
  return;
}

Assistant:

TextureViewVkImpl::~TextureViewVkImpl()
{
    if (FramebufferCache* FBCache = m_pDevice->GetFramebufferCache())
    {
        if (m_Desc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL ||
            m_Desc.ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL ||
            m_Desc.ViewType == TEXTURE_VIEW_RENDER_TARGET ||
            m_Desc.ViewType == TEXTURE_VIEW_SHADING_RATE)
        {
            FBCache->OnDestroyImageView(m_ImageView);
        }
    }
    m_pDevice->SafeReleaseDeviceObject(std::move(m_ImageView), m_pTexture->GetDesc().ImmediateContextMask);
}